

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  uint uVar2;
  BVH *bvh;
  NodeRef root;
  ulong uVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  size_t k;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [28];
  byte bVar32;
  int iVar33;
  ulong uVar34;
  byte bVar35;
  byte bVar36;
  long lVar37;
  byte bVar38;
  ulong *puVar39;
  ulong uVar40;
  undefined4 uVar41;
  ulong uVar42;
  undefined1 (*pauVar43) [32];
  bool bVar44;
  ulong uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar71;
  undefined1 auVar73 [36];
  undefined1 auVar72 [64];
  undefined1 extraout_var [36];
  undefined1 extraout_var_00 [36];
  float fVar75;
  undefined1 auVar76 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar78 [36];
  undefined1 auVar77 [64];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  uint uVar104;
  uint uVar105;
  uint uVar106;
  uint uVar107;
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar117 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2b71;
  ulong local_2b70;
  Geometry *local_2b68;
  RayK<8> *local_2b60;
  undefined1 (*local_2b58) [32];
  RTCFilterFunctionNArguments local_2b50;
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  ulong local_2aa8;
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined8 local_29b0;
  undefined8 uStack_29a8;
  undefined1 local_29a0 [32];
  float local_2980;
  float fStack_297c;
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  int iStack_2964;
  RTCHitN local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  uint local_2880;
  uint uStack_287c;
  uint uStack_2878;
  uint uStack_2874;
  uint uStack_2870;
  uint uStack_286c;
  uint uStack_2868;
  uint uStack_2864;
  uint local_2860;
  uint uStack_285c;
  uint uStack_2858;
  uint uStack_2854;
  uint uStack_2850;
  uint uStack_284c;
  uint uStack_2848;
  uint uStack_2844;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [32];
  int local_26c0;
  int iStack_26bc;
  int iStack_26b8;
  int iStack_26b4;
  int iStack_26b0;
  int iStack_26ac;
  int iStack_26a8;
  int iStack_26a4;
  uint local_26a0;
  uint uStack_269c;
  uint uStack_2698;
  uint uStack_2694;
  uint uStack_2690;
  uint uStack_268c;
  uint uStack_2688;
  uint uStack_2684;
  uint local_2680;
  uint uStack_267c;
  uint uStack_2678;
  uint uStack_2674;
  uint uStack_2670;
  uint uStack_266c;
  uint uStack_2668;
  uint uStack_2664;
  uint local_2660;
  uint uStack_265c;
  uint uStack_2658;
  uint uStack_2654;
  uint uStack_2650;
  uint uStack_264c;
  uint uStack_2648;
  uint uStack_2644;
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  undefined1 auVar74 [36];
  undefined1 auVar79 [36];
  undefined1 auVar96 [32];
  undefined1 auVar101 [32];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar49 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar46 = ZEXT816(0) << 0x40;
      uVar45 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar46),5);
      uVar42 = vpcmpeqd_avx512vl(auVar49,(undefined1  [32])valid_i->field_0);
      uVar45 = uVar45 & uVar42;
      bVar32 = (byte)uVar45;
      if (bVar32 != 0) {
        local_2840._0_4_ = *(undefined4 *)ray;
        local_2840._4_4_ = *(undefined4 *)(ray + 4);
        local_2840._8_4_ = *(undefined4 *)(ray + 8);
        local_2840._12_4_ = *(undefined4 *)(ray + 0xc);
        local_2840._16_4_ = *(undefined4 *)(ray + 0x10);
        local_2840._20_4_ = *(undefined4 *)(ray + 0x14);
        local_2840._24_4_ = *(undefined4 *)(ray + 0x18);
        local_2840._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_2840._32_4_ = *(undefined4 *)(ray + 0x20);
        local_2840._36_4_ = *(undefined4 *)(ray + 0x24);
        local_2840._40_4_ = *(undefined4 *)(ray + 0x28);
        local_2840._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_2840._48_4_ = *(undefined4 *)(ray + 0x30);
        local_2840._52_4_ = *(undefined4 *)(ray + 0x34);
        local_2840._56_4_ = *(undefined4 *)(ray + 0x38);
        local_2840._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_2840._64_4_ = *(undefined4 *)(ray + 0x40);
        local_2840._68_4_ = *(undefined4 *)(ray + 0x44);
        local_2840._72_4_ = *(undefined4 *)(ray + 0x48);
        local_2840._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_2840._80_4_ = *(undefined4 *)(ray + 0x50);
        local_2840._84_4_ = *(undefined4 *)(ray + 0x54);
        local_2840._88_4_ = *(undefined4 *)(ray + 0x58);
        local_2840._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar113 = ZEXT3264(auVar49);
        vandps_avx512vl(local_27e0,auVar49);
        auVar50._8_4_ = 0x219392ef;
        auVar50._0_8_ = 0x219392ef219392ef;
        auVar50._12_4_ = 0x219392ef;
        auVar50._16_4_ = 0x219392ef;
        auVar50._20_4_ = 0x219392ef;
        auVar50._24_4_ = 0x219392ef;
        auVar50._28_4_ = 0x219392ef;
        uVar42 = vcmpps_avx512vl(auVar49,auVar50,1);
        bVar44 = (bool)((byte)uVar42 & 1);
        auVar51._0_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27e0._0_4_;
        bVar44 = (bool)((byte)(uVar42 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27e0._4_4_;
        bVar44 = (bool)((byte)(uVar42 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27e0._8_4_;
        bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27e0._12_4_;
        bVar44 = (bool)((byte)(uVar42 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27e0._16_4_;
        bVar44 = (bool)((byte)(uVar42 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27e0._20_4_;
        bVar44 = (bool)((byte)(uVar42 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27e0._24_4_;
        bVar44 = SUB81(uVar42 >> 7,0);
        auVar51._28_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27e0._28_4_;
        vandps_avx512vl(local_27c0,auVar49);
        uVar42 = vcmpps_avx512vl(auVar51,auVar50,1);
        bVar44 = (bool)((byte)uVar42 & 1);
        auVar52._0_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27c0._0_4_;
        bVar44 = (bool)((byte)(uVar42 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27c0._4_4_;
        bVar44 = (bool)((byte)(uVar42 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27c0._8_4_;
        bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27c0._12_4_;
        bVar44 = (bool)((byte)(uVar42 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27c0._16_4_;
        bVar44 = (bool)((byte)(uVar42 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27c0._20_4_;
        bVar44 = (bool)((byte)(uVar42 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27c0._24_4_;
        bVar44 = SUB81(uVar42 >> 7,0);
        auVar52._28_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27c0._28_4_;
        vandps_avx512vl(local_27a0,auVar49);
        uVar42 = vcmpps_avx512vl(auVar52,auVar50,1);
        bVar44 = (bool)((byte)uVar42 & 1);
        auVar49._0_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27a0._0_4_;
        bVar44 = (bool)((byte)(uVar42 >> 1) & 1);
        auVar49._4_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27a0._4_4_;
        bVar44 = (bool)((byte)(uVar42 >> 2) & 1);
        auVar49._8_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27a0._8_4_;
        bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
        auVar49._12_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27a0._12_4_;
        bVar44 = (bool)((byte)(uVar42 >> 4) & 1);
        auVar49._16_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27a0._16_4_;
        bVar44 = (bool)((byte)(uVar42 >> 5) & 1);
        auVar49._20_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27a0._20_4_;
        bVar44 = (bool)((byte)(uVar42 >> 6) & 1);
        auVar49._24_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27a0._24_4_;
        bVar44 = SUB81(uVar42 >> 7,0);
        auVar49._28_4_ = (uint)bVar44 * 0x219392ef | (uint)!bVar44 * local_27a0._28_4_;
        auVar53._8_4_ = 0x3f800000;
        auVar53._0_8_ = &DAT_3f8000003f800000;
        auVar53._12_4_ = 0x3f800000;
        auVar53._16_4_ = 0x3f800000;
        auVar53._20_4_ = 0x3f800000;
        auVar53._24_4_ = 0x3f800000;
        auVar53._28_4_ = 0x3f800000;
        auVar50 = vrcp14ps_avx512vl(auVar51);
        auVar47 = vfnmadd213ps_fma(auVar51,auVar50,auVar53);
        auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar50,auVar50);
        auVar51 = vrcp14ps_avx512vl(auVar52);
        auVar48 = vfnmadd213ps_fma(auVar52,auVar51,auVar53);
        auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar51,auVar51);
        auVar51 = vrcp14ps_avx512vl(auVar49);
        auVar95 = vfnmadd213ps_fma(auVar49,auVar51,auVar53);
        local_2780 = ZEXT1632(auVar47);
        local_2760 = ZEXT1632(auVar48);
        auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar51,auVar51);
        local_2740 = ZEXT1632(auVar95);
        local_2720 = (float)local_2840._0_4_ * auVar47._0_4_;
        fStack_271c = (float)local_2840._4_4_ * auVar47._4_4_;
        fStack_2718 = (float)local_2840._8_4_ * auVar47._8_4_;
        fStack_2714 = (float)local_2840._12_4_ * auVar47._12_4_;
        fStack_2710 = (float)local_2840._16_4_ * 0.0;
        fStack_270c = (float)local_2840._20_4_ * 0.0;
        fStack_2708 = (float)local_2840._24_4_ * 0.0;
        local_2700 = (float)local_2840._32_4_ * auVar48._0_4_;
        fStack_26fc = (float)local_2840._36_4_ * auVar48._4_4_;
        fStack_26f8 = (float)local_2840._40_4_ * auVar48._8_4_;
        fStack_26f4 = (float)local_2840._44_4_ * auVar48._12_4_;
        fStack_26f0 = (float)local_2840._48_4_ * 0.0;
        fStack_26ec = (float)local_2840._52_4_ * 0.0;
        fStack_26e8 = (float)local_2840._56_4_ * 0.0;
        local_26e0._4_4_ = (float)local_2840._68_4_ * auVar95._4_4_;
        local_26e0._0_4_ = (float)local_2840._64_4_ * auVar95._0_4_;
        local_26e0._8_4_ = (float)local_2840._72_4_ * auVar95._8_4_;
        local_26e0._12_4_ = (float)local_2840._76_4_ * auVar95._12_4_;
        local_26e0._16_4_ = (float)local_2840._80_4_ * 0.0;
        local_26e0._20_4_ = (float)local_2840._84_4_ * 0.0;
        local_26e0._24_4_ = (float)local_2840._88_4_ * 0.0;
        local_26e0._28_4_ = local_2840._92_4_;
        uVar42 = vcmpps_avx512vl(ZEXT1632(auVar47),ZEXT1632(auVar46),1);
        auVar49 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_26c0 = (uint)((byte)uVar42 & 1) * auVar49._0_4_;
        iStack_26bc = (uint)((byte)(uVar42 >> 1) & 1) * auVar49._4_4_;
        iStack_26b8 = (uint)((byte)(uVar42 >> 2) & 1) * auVar49._8_4_;
        iStack_26b4 = (uint)((byte)(uVar42 >> 3) & 1) * auVar49._12_4_;
        iStack_26b0 = (uint)((byte)(uVar42 >> 4) & 1) * auVar49._16_4_;
        iStack_26ac = (uint)((byte)(uVar42 >> 5) & 1) * auVar49._20_4_;
        iStack_26a8 = (uint)((byte)(uVar42 >> 6) & 1) * auVar49._24_4_;
        iStack_26a4 = (uint)(byte)(uVar42 >> 7) * auVar49._28_4_;
        auVar51 = ZEXT1632(auVar46);
        uVar42 = vcmpps_avx512vl(ZEXT1632(auVar48),auVar51,5);
        auVar49 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar44 = (bool)((byte)uVar42 & 1);
        local_26a0 = (uint)bVar44 * auVar49._0_4_ | (uint)!bVar44 * 0x30;
        bVar44 = (bool)((byte)(uVar42 >> 1) & 1);
        uStack_269c = (uint)bVar44 * auVar49._4_4_ | (uint)!bVar44 * 0x30;
        bVar44 = (bool)((byte)(uVar42 >> 2) & 1);
        uStack_2698 = (uint)bVar44 * auVar49._8_4_ | (uint)!bVar44 * 0x30;
        bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
        uStack_2694 = (uint)bVar44 * auVar49._12_4_ | (uint)!bVar44 * 0x30;
        bVar44 = (bool)((byte)(uVar42 >> 4) & 1);
        uStack_2690 = (uint)bVar44 * auVar49._16_4_ | (uint)!bVar44 * 0x30;
        bVar44 = (bool)((byte)(uVar42 >> 5) & 1);
        uStack_268c = (uint)bVar44 * auVar49._20_4_ | (uint)!bVar44 * 0x30;
        bVar44 = (bool)((byte)(uVar42 >> 6) & 1);
        uStack_2688 = (uint)bVar44 * auVar49._24_4_ | (uint)!bVar44 * 0x30;
        bVar44 = SUB81(uVar42 >> 7,0);
        uStack_2684 = (uint)bVar44 * auVar49._28_4_ | (uint)!bVar44 * 0x30;
        uVar42 = vcmpps_avx512vl(ZEXT1632(auVar95),auVar51,5);
        auVar49 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar44 = (bool)((byte)uVar42 & 1);
        local_2680 = (uint)bVar44 * auVar49._0_4_ | (uint)!bVar44 * 0x50;
        bVar44 = (bool)((byte)(uVar42 >> 1) & 1);
        uStack_267c = (uint)bVar44 * auVar49._4_4_ | (uint)!bVar44 * 0x50;
        bVar44 = (bool)((byte)(uVar42 >> 2) & 1);
        uStack_2678 = (uint)bVar44 * auVar49._8_4_ | (uint)!bVar44 * 0x50;
        bVar44 = (bool)((byte)(uVar42 >> 3) & 1);
        uStack_2674 = (uint)bVar44 * auVar49._12_4_ | (uint)!bVar44 * 0x50;
        bVar44 = (bool)((byte)(uVar42 >> 4) & 1);
        uStack_2670 = (uint)bVar44 * auVar49._16_4_ | (uint)!bVar44 * 0x50;
        bVar44 = (bool)((byte)(uVar42 >> 5) & 1);
        uStack_266c = (uint)bVar44 * auVar49._20_4_ | (uint)!bVar44 * 0x50;
        bVar44 = (bool)((byte)(uVar42 >> 6) & 1);
        uStack_2668 = (uint)bVar44 * auVar49._24_4_ | (uint)!bVar44 * 0x50;
        bVar44 = SUB81(uVar42 >> 7,0);
        uStack_2664 = (uint)bVar44 * auVar49._28_4_ | (uint)!bVar44 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar115 = ZEXT3264(local_1e80);
        auVar49 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar51);
        local_2660 = (uint)(bVar32 & 1) * auVar49._0_4_ |
                     (uint)!(bool)(bVar32 & 1) * local_1e80._0_4_;
        bVar44 = (bool)((byte)(uVar45 >> 1) & 1);
        uStack_265c = (uint)bVar44 * auVar49._4_4_ | (uint)!bVar44 * local_1e80._4_4_;
        bVar44 = (bool)((byte)(uVar45 >> 2) & 1);
        uStack_2658 = (uint)bVar44 * auVar49._8_4_ | (uint)!bVar44 * local_1e80._8_4_;
        bVar44 = (bool)((byte)(uVar45 >> 3) & 1);
        uStack_2654 = (uint)bVar44 * auVar49._12_4_ | (uint)!bVar44 * local_1e80._12_4_;
        bVar44 = (bool)((byte)(uVar45 >> 4) & 1);
        uStack_2650 = (uint)bVar44 * auVar49._16_4_ | (uint)!bVar44 * local_1e80._16_4_;
        bVar44 = (bool)((byte)(uVar45 >> 5) & 1);
        uStack_264c = (uint)bVar44 * auVar49._20_4_ | (uint)!bVar44 * local_1e80._20_4_;
        bVar44 = (bool)((byte)(uVar45 >> 6) & 1);
        uStack_2648 = (uint)bVar44 * auVar49._24_4_ | (uint)!bVar44 * local_1e80._24_4_;
        bVar44 = SUB81(uVar45 >> 7,0);
        uStack_2644 = (uint)bVar44 * auVar49._28_4_ | (uint)!bVar44 * local_1e80._28_4_;
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar114 = ZEXT3264(auVar49);
        auVar51 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar51);
        local_2640._0_4_ =
             (uint)(bVar32 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar49._0_4_;
        bVar44 = (bool)((byte)(uVar45 >> 1) & 1);
        local_2640._4_4_ = (uint)bVar44 * auVar51._4_4_ | (uint)!bVar44 * auVar49._4_4_;
        bVar44 = (bool)((byte)(uVar45 >> 2) & 1);
        local_2640._8_4_ = (uint)bVar44 * auVar51._8_4_ | (uint)!bVar44 * auVar49._8_4_;
        bVar44 = (bool)((byte)(uVar45 >> 3) & 1);
        local_2640._12_4_ = (uint)bVar44 * auVar51._12_4_ | (uint)!bVar44 * auVar49._12_4_;
        bVar44 = (bool)((byte)(uVar45 >> 4) & 1);
        local_2640._16_4_ = (uint)bVar44 * auVar51._16_4_ | (uint)!bVar44 * auVar49._16_4_;
        bVar44 = (bool)((byte)(uVar45 >> 5) & 1);
        local_2640._20_4_ = (uint)bVar44 * auVar51._20_4_ | (uint)!bVar44 * auVar49._20_4_;
        bVar44 = (bool)((byte)(uVar45 >> 6) & 1);
        local_2640._24_4_ = (uint)bVar44 * auVar51._24_4_ | (uint)!bVar44 * auVar49._24_4_;
        bVar44 = SUB81(uVar45 >> 7,0);
        local_2640._28_4_ = (uint)bVar44 * auVar51._28_4_ | (uint)!bVar44 * auVar49._28_4_;
        bVar32 = ~bVar32;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar42 = 5;
        }
        else {
          uVar42 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2b60 = ray + 0x100;
        puVar39 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar43 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_2660;
        uStack_1e5c = uStack_265c;
        uStack_1e58 = uStack_2658;
        uStack_1e54 = uStack_2654;
        uStack_1e50 = uStack_2650;
        uStack_1e4c = uStack_264c;
        uStack_1e48 = uStack_2648;
        uStack_1e44 = uStack_2644;
        local_2608 = (bvh->root).ptr;
        local_2b58 = (undefined1 (*) [32])&local_2880;
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar116 = ZEXT3264(auVar49);
        auVar46 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        auVar117 = ZEXT1664(auVar46);
        local_2b70 = uVar42;
        uStack_2704 = local_2840._28_4_;
        uStack_26e4 = local_2840._60_4_;
LAB_007a838a:
        pauVar43 = pauVar43 + -1;
        root.ptr = puVar39[-1];
        puVar39 = puVar39 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_007a907d;
        auVar49 = *pauVar43;
        uVar34 = vcmpps_avx512vl(auVar49,local_2640,1);
        if ((char)uVar34 == '\0') {
LAB_007a908e:
          iVar33 = 2;
        }
        else {
          uVar41 = (undefined4)uVar34;
          iVar33 = 0;
          if ((uint)POPCOUNT(uVar41) <= uVar42) {
            do {
              local_29a0 = auVar49;
              k = 0;
              for (uVar42 = uVar34; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              bVar44 = occluded1(This,bvh,root,k,&local_2b71,ray,
                                 (TravRayK<8,_false> *)&local_2840.field_0,context);
              bVar38 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar44) {
                bVar38 = 0;
              }
              bVar32 = bVar32 | bVar38;
              uVar34 = uVar34 - 1 & uVar34;
              auVar49 = local_29a0;
            } while (uVar34 != 0);
            if (bVar32 == 0xff) {
              iVar33 = 3;
            }
            else {
              auVar51 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_2640._0_4_ =
                   (uint)(bVar32 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar32 & 1) * local_2640._0_4_
              ;
              bVar44 = (bool)(bVar32 >> 1 & 1);
              local_2640._4_4_ = (uint)bVar44 * auVar51._4_4_ | (uint)!bVar44 * local_2640._4_4_;
              bVar44 = (bool)(bVar32 >> 2 & 1);
              local_2640._8_4_ = (uint)bVar44 * auVar51._8_4_ | (uint)!bVar44 * local_2640._8_4_;
              bVar44 = (bool)(bVar32 >> 3 & 1);
              local_2640._12_4_ = (uint)bVar44 * auVar51._12_4_ | (uint)!bVar44 * local_2640._12_4_;
              bVar44 = (bool)(bVar32 >> 4 & 1);
              local_2640._16_4_ = (uint)bVar44 * auVar51._16_4_ | (uint)!bVar44 * local_2640._16_4_;
              bVar44 = (bool)(bVar32 >> 5 & 1);
              local_2640._20_4_ = (uint)bVar44 * auVar51._20_4_ | (uint)!bVar44 * local_2640._20_4_;
              bVar44 = (bool)(bVar32 >> 6 & 1);
              local_2640._24_4_ = (uint)bVar44 * auVar51._24_4_ | (uint)!bVar44 * local_2640._24_4_;
              local_2640._28_4_ =
                   (uint)(bVar32 >> 7) * auVar51._28_4_ |
                   (uint)!(bool)(bVar32 >> 7) * local_2640._28_4_;
              iVar33 = 2;
            }
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar113 = ZEXT3264(auVar51);
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar114 = ZEXT3264(auVar51);
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar115 = ZEXT3264(auVar51);
            uVar45 = uVar45 & 0xffffffff;
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar116 = ZEXT3264(auVar51);
            auVar46 = vxorps_avx512vl(auVar117._0_16_,auVar117._0_16_);
            auVar117 = ZEXT1664(auVar46);
          }
          uVar42 = local_2b70;
          if ((uint)local_2b70 < (uint)POPCOUNT(uVar41)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007a907d;
                uVar14 = vcmpps_avx512vl(auVar49,local_2640,9);
                if ((char)uVar14 == '\0') goto LAB_007a908e;
                uVar42 = (ulong)((uint)root.ptr & 0xf);
                bVar38 = bVar32;
                if (uVar42 == 8) goto LAB_007a904e;
                bVar38 = ~bVar32;
                lVar37 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar34 = 0;
                goto LAB_007a85a4;
              }
              auVar103 = ZEXT3264(auVar115._0_32_);
              uVar34 = 0;
              uVar40 = 8;
              do {
                uVar3 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar34 * 8);
                if (uVar3 != 8) {
                  auVar28._4_4_ = fStack_271c;
                  auVar28._0_4_ = local_2720;
                  auVar28._8_4_ = fStack_2718;
                  auVar28._12_4_ = fStack_2714;
                  auVar28._16_4_ = fStack_2710;
                  auVar28._20_4_ = fStack_270c;
                  auVar28._24_4_ = fStack_2708;
                  auVar28._28_4_ = uStack_2704;
                  uVar41 = *(undefined4 *)(root.ptr + 0x20 + uVar34 * 4);
                  auVar87._4_4_ = uVar41;
                  auVar87._0_4_ = uVar41;
                  auVar87._8_4_ = uVar41;
                  auVar87._12_4_ = uVar41;
                  auVar87._16_4_ = uVar41;
                  auVar87._20_4_ = uVar41;
                  auVar87._24_4_ = uVar41;
                  auVar87._28_4_ = uVar41;
                  auVar46 = vfmsub132ps_fma(auVar87,auVar28,local_2780);
                  auVar29._4_4_ = fStack_26fc;
                  auVar29._0_4_ = local_2700;
                  auVar29._8_4_ = fStack_26f8;
                  auVar29._12_4_ = fStack_26f4;
                  auVar29._16_4_ = fStack_26f0;
                  auVar29._20_4_ = fStack_26ec;
                  auVar29._24_4_ = fStack_26e8;
                  auVar29._28_4_ = uStack_26e4;
                  uVar41 = *(undefined4 *)(root.ptr + 0x40 + uVar34 * 4);
                  auVar93._4_4_ = uVar41;
                  auVar93._0_4_ = uVar41;
                  auVar93._8_4_ = uVar41;
                  auVar93._12_4_ = uVar41;
                  auVar93._16_4_ = uVar41;
                  auVar93._20_4_ = uVar41;
                  auVar93._24_4_ = uVar41;
                  auVar93._28_4_ = uVar41;
                  uVar41 = *(undefined4 *)(root.ptr + 0x60 + uVar34 * 4);
                  auVar100._4_4_ = uVar41;
                  auVar100._0_4_ = uVar41;
                  auVar100._8_4_ = uVar41;
                  auVar100._12_4_ = uVar41;
                  auVar100._16_4_ = uVar41;
                  auVar100._20_4_ = uVar41;
                  auVar100._24_4_ = uVar41;
                  auVar100._28_4_ = uVar41;
                  auVar47 = vfmsub132ps_fma(auVar93,auVar29,local_2760);
                  auVar48 = vfmsub132ps_fma(auVar100,local_26e0,local_2740);
                  uVar41 = *(undefined4 *)(root.ptr + 0x30 + uVar34 * 4);
                  auVar19._4_4_ = uVar41;
                  auVar19._0_4_ = uVar41;
                  auVar19._8_4_ = uVar41;
                  auVar19._12_4_ = uVar41;
                  auVar19._16_4_ = uVar41;
                  auVar19._20_4_ = uVar41;
                  auVar19._24_4_ = uVar41;
                  auVar19._28_4_ = uVar41;
                  auVar52 = vfmsub132ps_avx512vl(local_2780,auVar28,auVar19);
                  uVar41 = *(undefined4 *)(root.ptr + 0x50 + uVar34 * 4);
                  auVar20._4_4_ = uVar41;
                  auVar20._0_4_ = uVar41;
                  auVar20._8_4_ = uVar41;
                  auVar20._12_4_ = uVar41;
                  auVar20._16_4_ = uVar41;
                  auVar20._20_4_ = uVar41;
                  auVar20._24_4_ = uVar41;
                  auVar20._28_4_ = uVar41;
                  auVar50 = vfmsub132ps_avx512vl(local_2760,auVar29,auVar20);
                  uVar41 = *(undefined4 *)(root.ptr + 0x70 + uVar34 * 4);
                  auVar21._4_4_ = uVar41;
                  auVar21._0_4_ = uVar41;
                  auVar21._8_4_ = uVar41;
                  auVar21._12_4_ = uVar41;
                  auVar21._16_4_ = uVar41;
                  auVar21._20_4_ = uVar41;
                  auVar21._24_4_ = uVar41;
                  auVar21._28_4_ = uVar41;
                  auVar53 = vfmsub132ps_avx512vl(local_2740,local_26e0,auVar21);
                  auVar49 = vpminsd_avx2(ZEXT1632(auVar46),auVar52);
                  auVar51 = vpminsd_avx2(ZEXT1632(auVar47),auVar50);
                  auVar49 = vpmaxsd_avx2(auVar49,auVar51);
                  auVar51 = vpminsd_avx2(ZEXT1632(auVar48),auVar53);
                  auVar49 = vpmaxsd_avx2(auVar49,auVar51);
                  auVar51 = vpmaxsd_avx2(ZEXT1632(auVar46),auVar52);
                  auVar52 = vpmaxsd_avx2(ZEXT1632(auVar47),auVar50);
                  auVar52 = vpminsd_avx2(auVar51,auVar52);
                  auVar51 = vpmaxsd_avx2(ZEXT1632(auVar48),auVar53);
                  auVar52 = vpminsd_avx2(auVar52,auVar51);
                  auVar30._4_4_ = uStack_265c;
                  auVar30._0_4_ = local_2660;
                  auVar30._8_4_ = uStack_2658;
                  auVar30._12_4_ = uStack_2654;
                  auVar30._16_4_ = uStack_2650;
                  auVar30._20_4_ = uStack_264c;
                  auVar30._24_4_ = uStack_2648;
                  auVar30._28_4_ = uStack_2644;
                  auVar51 = vpmaxsd_avx2(auVar49,auVar30);
                  auVar52 = vpminsd_avx2(auVar52,local_2640);
                  uVar16 = vpcmpd_avx512vl(auVar51,auVar52,2);
                  if ((byte)uVar16 != 0) {
                    auVar51 = vblendmps_avx512vl(auVar115._0_32_,auVar49);
                    bVar44 = (bool)((byte)uVar16 & 1);
                    bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
                    bVar8 = (bool)((byte)(uVar16 >> 2) & 1);
                    bVar9 = (bool)((byte)(uVar16 >> 3) & 1);
                    bVar10 = (bool)((byte)(uVar16 >> 4) & 1);
                    bVar11 = (bool)((byte)(uVar16 >> 5) & 1);
                    bVar12 = (bool)((byte)(uVar16 >> 6) & 1);
                    bVar13 = SUB81(uVar16 >> 7,0);
                    if (uVar40 != 8) {
                      *puVar39 = uVar40;
                      puVar39 = puVar39 + 1;
                      *pauVar43 = auVar103._0_32_;
                      pauVar43 = pauVar43 + 1;
                    }
                    auVar103 = ZEXT3264(CONCAT428((uint)bVar13 * auVar51._28_4_ |
                                                  (uint)!bVar13 * auVar49._28_4_,
                                                  CONCAT424((uint)bVar12 * auVar51._24_4_ |
                                                            (uint)!bVar12 * auVar49._24_4_,
                                                            CONCAT420((uint)bVar11 * auVar51._20_4_
                                                                      | (uint)!bVar11 *
                                                                        auVar49._20_4_,
                                                                      CONCAT416((uint)bVar10 *
                                                                                auVar51._16_4_ |
                                                                                (uint)!bVar10 *
                                                                                auVar49._16_4_,
                                                                                CONCAT412((uint)
                                                  bVar9 * auVar51._12_4_ |
                                                  (uint)!bVar9 * auVar49._12_4_,
                                                  CONCAT48((uint)bVar8 * auVar51._8_4_ |
                                                           (uint)!bVar8 * auVar49._8_4_,
                                                           CONCAT44((uint)bVar7 * auVar51._4_4_ |
                                                                    (uint)!bVar7 * auVar49._4_4_,
                                                                    (uint)bVar44 * auVar51._0_4_ |
                                                                    (uint)!bVar44 * auVar49._0_4_)))
                                                  )))));
                    uVar40 = uVar3;
                  }
                }
                auVar49 = auVar103._0_32_;
              } while ((uVar3 != 8) && (bVar44 = uVar34 < 3, uVar34 = uVar34 + 1, bVar44));
              iVar33 = 0;
              if (uVar40 == 8) {
LAB_007a8557:
                bVar44 = false;
                iVar33 = 4;
              }
              else {
                uVar14 = vcmpps_avx512vl(auVar49,local_2640,9);
                bVar44 = true;
                if ((uint)POPCOUNT((int)uVar14) <= (uint)local_2b70) {
                  *puVar39 = uVar40;
                  puVar39 = puVar39 + 1;
                  *pauVar43 = auVar49;
                  pauVar43 = pauVar43 + 1;
                  goto LAB_007a8557;
                }
              }
              root.ptr = uVar40;
            } while (bVar44);
          }
        }
        goto LAB_007a9080;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar34 = local_2aa8 + 1;
    lVar37 = lVar37 + 0xe0;
    if (uVar42 - 8 <= uVar34) break;
LAB_007a85a4:
    local_29a0._0_8_ = uVar34 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    uVar40 = 0;
    local_2aa8 = uVar34;
    bVar36 = bVar38;
    while( true ) {
      auVar46 = auVar117._0_16_;
      uVar34 = (ulong)*(uint *)(lVar37 + uVar40 * 4);
      if (uVar34 == 0xffffffff) break;
      uVar41 = *(undefined4 *)(lVar37 + -0xc0 + uVar40 * 4);
      auVar48._4_4_ = uVar41;
      auVar48._0_4_ = uVar41;
      auVar48._8_4_ = uVar41;
      auVar48._12_4_ = uVar41;
      auVar88._16_4_ = uVar41;
      auVar88._0_16_ = auVar48;
      auVar88._20_4_ = uVar41;
      auVar88._24_4_ = uVar41;
      auVar88._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0xb0 + uVar40 * 4);
      auVar95._4_4_ = uVar41;
      auVar95._0_4_ = uVar41;
      auVar95._8_4_ = uVar41;
      auVar95._12_4_ = uVar41;
      auVar96._16_4_ = uVar41;
      auVar96._0_16_ = auVar95;
      auVar96._20_4_ = uVar41;
      auVar96._24_4_ = uVar41;
      auVar96._28_4_ = uVar41;
      uVar41 = *(undefined4 *)(lVar37 + -0xa0 + uVar40 * 4);
      auVar99._4_4_ = uVar41;
      auVar99._0_4_ = uVar41;
      auVar99._8_4_ = uVar41;
      auVar99._12_4_ = uVar41;
      auVar101._16_4_ = uVar41;
      auVar101._0_16_ = auVar99;
      auVar101._20_4_ = uVar41;
      auVar101._24_4_ = uVar41;
      auVar101._28_4_ = uVar41;
      auVar54 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar37 + -0x90 + uVar40 * 4)));
      auVar55 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar37 + -0x80 + uVar40 * 4)));
      auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar37 + -0x70 + uVar40 * 4)));
      auVar57 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar37 + -0x60 + uVar40 * 4)));
      auVar58 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar37 + -0x50 + uVar40 * 4)));
      auVar59 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar37 + -0x40 + uVar40 * 4)));
      auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar37 + -0x30 + uVar40 * 4)));
      auVar61 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar37 + -0x20 + uVar40 * 4)));
      auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar37 + -0x10 + uVar40 * 4)));
      local_29b0 = *(undefined8 *)(local_29a0._0_8_ + 0xd0);
      uStack_29a8 = *(undefined8 *)(local_29a0._0_8_ + 0xd8);
      auVar47 = vsubss_avx512f(auVar48,auVar54._0_16_);
      fVar75 = auVar47._0_4_;
      auVar80._4_4_ = fVar75;
      auVar80._0_4_ = fVar75;
      auVar80._8_4_ = fVar75;
      auVar80._12_4_ = fVar75;
      auVar80._16_4_ = fVar75;
      auVar80._20_4_ = fVar75;
      auVar80._24_4_ = fVar75;
      auVar80._28_4_ = fVar75;
      auVar47 = vsubss_avx512f(auVar95,auVar55._0_16_);
      fVar70 = auVar47._0_4_;
      auVar89._4_4_ = fVar70;
      auVar89._0_4_ = fVar70;
      auVar89._8_4_ = fVar70;
      auVar89._12_4_ = fVar70;
      auVar89._16_4_ = fVar70;
      auVar89._20_4_ = fVar70;
      auVar89._24_4_ = fVar70;
      auVar89._28_4_ = fVar70;
      auVar47 = vsubss_avx512f(auVar99,auVar56._0_16_);
      fVar71 = auVar47._0_4_;
      auVar65._4_4_ = fVar71;
      auVar65._0_4_ = fVar71;
      auVar65._8_4_ = fVar71;
      auVar65._12_4_ = fVar71;
      auVar65._16_4_ = fVar71;
      auVar65._20_4_ = fVar71;
      auVar65._24_4_ = fVar71;
      auVar65._28_4_ = fVar71;
      auVar47 = vsubss_avx512f(auVar60._0_16_,auVar48);
      fVar92 = auVar47._0_4_;
      auVar112._4_4_ = fVar92;
      auVar112._0_4_ = fVar92;
      auVar112._8_4_ = fVar92;
      auVar112._12_4_ = fVar92;
      auVar112._16_4_ = fVar92;
      auVar112._20_4_ = fVar92;
      auVar112._24_4_ = fVar92;
      auVar112._28_4_ = fVar92;
      auVar47 = vsubss_avx512f(auVar61._0_16_,auVar95);
      auVar63 = vbroadcastss_avx512vl(auVar47);
      auVar48 = vsubss_avx512f(auVar62._0_16_,auVar99);
      auVar64 = vbroadcastss_avx512vl(auVar48);
      fVar70 = auVar48._0_4_ * fVar70;
      auVar67._4_4_ = fVar70;
      auVar67._0_4_ = fVar70;
      auVar67._8_4_ = fVar70;
      auVar67._12_4_ = fVar70;
      auVar67._16_4_ = fVar70;
      auVar67._20_4_ = fVar70;
      auVar67._24_4_ = fVar70;
      auVar67._28_4_ = fVar70;
      auVar65 = vfmsub231ps_avx512vl(auVar67,auVar63,auVar65);
      fVar92 = fVar71 * fVar92;
      auVar66._4_4_ = fVar92;
      auVar66._0_4_ = fVar92;
      auVar66._8_4_ = fVar92;
      auVar66._12_4_ = fVar92;
      auVar66._16_4_ = fVar92;
      auVar66._20_4_ = fVar92;
      auVar66._24_4_ = fVar92;
      auVar66._28_4_ = fVar92;
      auVar66 = vfmsub231ps_avx512vl(auVar66,auVar64,auVar80);
      uVar2 = auVar66._28_4_;
      auVar74 = ZEXT436(uVar2);
      auVar73 = ZEXT436(uVar2);
      fVar75 = auVar47._0_4_ * fVar75;
      auVar76._4_4_ = fVar75;
      auVar76._0_4_ = fVar75;
      auVar76._8_4_ = fVar75;
      auVar76._12_4_ = fVar75;
      auVar76._16_4_ = fVar75;
      auVar76._20_4_ = fVar75;
      auVar76._24_4_ = fVar75;
      auVar76._28_4_ = fVar75;
      auVar95 = vfmsub231ps_fma(auVar76,auVar112,auVar89);
      auVar79 = (undefined1  [36])0x0;
      auVar78 = (undefined1  [36])0x0;
      auVar50 = vsubps_avx(auVar88,*(undefined1 (*) [32])ray);
      auVar53 = vsubps_avx(auVar96,*(undefined1 (*) [32])(ray + 0x20));
      auVar67 = vsubps_avx(auVar101,*(undefined1 (*) [32])(ray + 0x40));
      auVar49 = *(undefined1 (*) [32])(ray + 0x80);
      auVar51 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar52 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar103._0_4_ = auVar51._0_4_ * auVar67._0_4_;
      auVar103._4_4_ = auVar51._4_4_ * auVar67._4_4_;
      auVar103._8_4_ = auVar51._8_4_ * auVar67._8_4_;
      auVar103._12_4_ = auVar51._12_4_ * auVar67._12_4_;
      auVar103._16_4_ = auVar51._16_4_ * auVar67._16_4_;
      auVar103._20_4_ = auVar51._20_4_ * auVar67._20_4_;
      auVar103._28_36_ = in_ZMM12._28_36_;
      auVar103._24_4_ = auVar51._24_4_ * auVar67._24_4_;
      auVar99 = vfmsub231ps_fma(auVar103._0_32_,auVar53,auVar52);
      in_ZMM12 = ZEXT1664(auVar99);
      auVar108._0_4_ = auVar52._0_4_ * auVar50._0_4_;
      auVar108._4_4_ = auVar52._4_4_ * auVar50._4_4_;
      auVar108._8_4_ = auVar52._8_4_ * auVar50._8_4_;
      auVar108._12_4_ = auVar52._12_4_ * auVar50._12_4_;
      auVar108._16_4_ = auVar52._16_4_ * auVar50._16_4_;
      auVar108._20_4_ = auVar52._20_4_ * auVar50._20_4_;
      auVar108._28_36_ = in_ZMM13._28_36_;
      auVar108._24_4_ = auVar52._24_4_ * auVar50._24_4_;
      auVar17 = vfmsub231ps_fma(auVar108._0_32_,auVar67,auVar49);
      in_ZMM13 = ZEXT1664(auVar17);
      auVar110._0_4_ = auVar49._0_4_ * auVar53._0_4_;
      auVar110._4_4_ = auVar49._4_4_ * auVar53._4_4_;
      auVar110._8_4_ = auVar49._8_4_ * auVar53._8_4_;
      auVar110._12_4_ = auVar49._12_4_ * auVar53._12_4_;
      auVar110._16_4_ = auVar49._16_4_ * auVar53._16_4_;
      auVar110._20_4_ = auVar49._20_4_ * auVar53._20_4_;
      auVar110._28_36_ = in_ZMM14._28_36_;
      auVar110._24_4_ = auVar49._24_4_ * auVar53._24_4_;
      auVar18 = vfmsub231ps_fma(auVar110._0_32_,auVar50,auVar51);
      in_ZMM14 = ZEXT1664(auVar18);
      auVar68._4_4_ = auVar52._4_4_ * auVar95._4_4_;
      auVar68._0_4_ = auVar52._0_4_ * auVar95._0_4_;
      auVar68._8_4_ = auVar52._8_4_ * auVar95._8_4_;
      auVar68._12_4_ = auVar52._12_4_ * auVar95._12_4_;
      auVar68._16_4_ = auVar52._16_4_ * 0.0;
      auVar68._20_4_ = auVar52._20_4_ * 0.0;
      auVar68._24_4_ = auVar52._24_4_ * 0.0;
      auVar68._28_4_ = auVar52._28_4_;
      auVar47 = vfmadd231ps_fma(auVar68,auVar66,auVar51);
      auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar65,auVar49);
      vandps_avx512vl(ZEXT1632(auVar47),auVar116._0_32_);
      auVar49 = vmulps_avx512vl(auVar64,ZEXT1632(auVar18));
      auVar49 = vfmadd231ps_avx512vl(auVar49,ZEXT1632(auVar17),auVar63);
      auVar48 = vfmadd231ps_fma(auVar49,ZEXT1632(auVar99),auVar112);
      uVar104 = auVar66._0_4_;
      auVar63._0_4_ = (float)(uVar104 ^ auVar48._0_4_);
      uVar105 = auVar66._4_4_;
      auVar63._4_4_ = (float)(uVar105 ^ auVar48._4_4_);
      uVar106 = auVar66._8_4_;
      auVar63._8_4_ = (float)(uVar106 ^ auVar48._8_4_);
      uVar107 = auVar66._12_4_;
      auVar63._12_4_ = (float)(uVar107 ^ auVar48._12_4_);
      fVar70 = auVar66._16_4_;
      auVar63._16_4_ = fVar70;
      fVar92 = auVar66._20_4_;
      auVar63._20_4_ = fVar92;
      fVar75 = auVar66._24_4_;
      auVar63._24_4_ = fVar75;
      auVar63._28_4_ = uVar2;
      uVar14 = vcmpps_avx512vl(auVar63,auVar117._0_32_,5);
      bVar35 = (byte)uVar14 & bVar36;
      if (bVar35 != 0) {
        auVar64._4_4_ = fVar71 * auVar18._4_4_;
        auVar64._0_4_ = fVar71 * auVar18._0_4_;
        auVar64._8_4_ = fVar71 * auVar18._8_4_;
        auVar64._12_4_ = fVar71 * auVar18._12_4_;
        auVar64._16_4_ = fVar71 * 0.0;
        auVar64._20_4_ = fVar71 * 0.0;
        auVar64._24_4_ = fVar71 * 0.0;
        auVar64._28_4_ = fVar71;
        auVar48 = vfmadd213ps_fma(auVar89,ZEXT1632(auVar17),auVar64);
        auVar48 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar99),ZEXT1632(auVar48));
        auVar90._0_4_ = (float)(uVar104 ^ auVar48._0_4_);
        auVar90._4_4_ = (float)(uVar105 ^ auVar48._4_4_);
        auVar90._8_4_ = (float)(uVar106 ^ auVar48._8_4_);
        auVar90._12_4_ = (float)(uVar107 ^ auVar48._12_4_);
        auVar90._16_4_ = fVar70;
        auVar90._20_4_ = fVar92;
        auVar90._24_4_ = fVar75;
        auVar90._28_4_ = uVar2;
        uVar14 = vcmpps_avx512vl(auVar90,auVar117._0_32_,5);
        bVar35 = bVar35 & (byte)uVar14;
        if (bVar35 != 0) {
          in_ZMM12 = ZEXT864(0) << 0x20;
          vandps_avx512vl(ZEXT1632(auVar47),auVar113._0_32_);
          auVar49 = vsubps_avx(auVar57,auVar63);
          uVar14 = vcmpps_avx512vl(auVar49,auVar90,5);
          bVar35 = bVar35 & (byte)uVar14;
          local_2b20 = auVar57;
          local_2b00 = auVar58;
          local_2aa0 = auVar62;
          local_2a80 = auVar61;
          local_2a60 = auVar60;
          local_2a40 = auVar56;
          local_2a20 = auVar55;
          local_2a00 = auVar54;
          local_29e0 = auVar59;
          auVar73 = auVar74;
          auVar78 = auVar79;
          if (bVar35 != 0) {
            auVar60._4_4_ = auVar67._4_4_ * auVar95._4_4_;
            auVar60._0_4_ = auVar67._0_4_ * auVar95._0_4_;
            auVar60._8_4_ = auVar67._8_4_ * auVar95._8_4_;
            auVar60._12_4_ = auVar67._12_4_ * auVar95._12_4_;
            auVar60._16_4_ = auVar67._16_4_ * 0.0;
            auVar60._20_4_ = auVar67._20_4_ * 0.0;
            auVar60._24_4_ = auVar67._24_4_ * 0.0;
            auVar60._28_4_ = auVar67._28_4_;
            auVar48 = vfmadd213ps_fma(auVar53,auVar66,auVar60);
            auVar48 = vfmadd213ps_fma(auVar50,auVar65,ZEXT1632(auVar48));
            auVar61._0_4_ = uVar104 ^ auVar48._0_4_;
            auVar61._4_4_ = uVar105 ^ auVar48._4_4_;
            auVar61._8_4_ = uVar106 ^ auVar48._8_4_;
            auVar61._12_4_ = uVar107 ^ auVar48._12_4_;
            auVar61._16_4_ = fVar70;
            auVar61._20_4_ = fVar92;
            auVar61._24_4_ = fVar75;
            auVar61._28_4_ = uVar2;
            auVar59._0_4_ = auVar57._0_4_ * *(float *)(ray + 0x60);
            auVar59._4_4_ = auVar57._4_4_ * *(float *)(ray + 100);
            auVar59._8_4_ = auVar57._8_4_ * *(float *)(ray + 0x68);
            auVar59._12_4_ = auVar57._12_4_ * *(float *)(ray + 0x6c);
            auVar59._16_4_ = auVar57._16_4_ * *(float *)(ray + 0x70);
            auVar59._20_4_ = auVar57._20_4_ * *(float *)(ray + 0x74);
            auVar59._24_4_ = auVar57._24_4_ * *(float *)(ray + 0x78);
            auVar59._28_4_ = 0;
            local_2980 = *(float *)(ray + 0x100);
            fStack_297c = *(float *)(ray + 0x104);
            fStack_2978 = *(float *)(ray + 0x108);
            fStack_2974 = *(float *)(ray + 0x10c);
            fStack_2970 = *(float *)(ray + 0x110);
            fStack_296c = *(float *)(ray + 0x114);
            fStack_2968 = *(float *)(ray + 0x118);
            iStack_2964 = *(int *)(ray + 0x11c);
            auVar58._4_4_ = fStack_297c * auVar57._4_4_;
            auVar58._0_4_ = local_2980 * auVar57._0_4_;
            auVar58._8_4_ = fStack_2978 * auVar57._8_4_;
            auVar58._12_4_ = fStack_2974 * auVar57._12_4_;
            auVar58._16_4_ = fStack_2970 * auVar57._16_4_;
            auVar58._20_4_ = fStack_296c * auVar57._20_4_;
            auVar58._24_4_ = fStack_2968 * auVar57._24_4_;
            auVar58._28_4_ = iStack_2964;
            uVar14 = vcmpps_avx512vl(auVar61,auVar58,2);
            uVar15 = vcmpps_avx512vl(auVar59,auVar61,1);
            bVar35 = bVar35 & (byte)uVar14 & (byte)uVar15;
            if (bVar35 != 0) {
              uVar14 = vcmpps_avx512vl(ZEXT1632(auVar47),ZEXT832(0) << 0x20,4);
              bVar35 = bVar35 & (byte)uVar14;
              if (bVar35 != 0) {
                local_2b68 = (context->scene->geometries).items[uVar34].ptr;
                uVar104 = local_2b68->mask;
                auVar62._4_4_ = uVar104;
                auVar62._0_4_ = uVar104;
                auVar62._8_4_ = uVar104;
                auVar62._12_4_ = uVar104;
                auVar62._16_4_ = uVar104;
                auVar62._20_4_ = uVar104;
                auVar62._24_4_ = uVar104;
                auVar62._28_4_ = uVar104;
                uVar14 = vptestmd_avx512vl(auVar62,*(undefined1 (*) [32])(ray + 0x120));
                bVar35 = bVar35 & (byte)uVar14;
                if (bVar35 != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (auVar73 = ZEXT436(uVar2), auVar78 = (undefined1  [36])0x0,
                     local_2b68->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar49 = vrcp14ps_avx512vl(auVar57);
                    auVar55._8_4_ = 0x3f800000;
                    auVar55._0_8_ = &DAT_3f8000003f800000;
                    auVar55._12_4_ = 0x3f800000;
                    auVar55._16_4_ = 0x3f800000;
                    auVar55._20_4_ = 0x3f800000;
                    auVar55._24_4_ = 0x3f800000;
                    auVar55._28_4_ = 0x3f800000;
                    auVar47 = vfnmadd213ps_fma(auVar57,auVar49,auVar55);
                    auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar49,auVar49);
                    auVar57._4_4_ = auVar47._4_4_ * auVar63._4_4_;
                    auVar57._0_4_ = auVar47._0_4_ * auVar63._0_4_;
                    auVar57._8_4_ = auVar47._8_4_ * auVar63._8_4_;
                    auVar57._12_4_ = auVar47._12_4_ * auVar63._12_4_;
                    auVar57._16_4_ = fVar70 * 0.0;
                    auVar57._20_4_ = fVar92 * 0.0;
                    auVar57._24_4_ = fVar75 * 0.0;
                    auVar57._28_4_ = uVar2;
                    local_2900 = vminps_avx(auVar57,auVar55);
                    auVar54._4_4_ = auVar47._4_4_ * auVar90._4_4_;
                    auVar54._0_4_ = auVar47._0_4_ * auVar90._0_4_;
                    auVar54._8_4_ = auVar47._8_4_ * auVar90._8_4_;
                    auVar54._12_4_ = auVar47._12_4_ * auVar90._12_4_;
                    auVar54._16_4_ = fVar70 * 0.0;
                    auVar54._20_4_ = fVar92 * 0.0;
                    auVar54._24_4_ = fVar75 * 0.0;
                    auVar54._28_4_ = uVar2;
                    local_28e0 = vminps_avx(auVar54,auVar55);
                    pRVar5 = context->user;
                    local_28a0 = vpbroadcastd_avx512vl();
                    local_28c0 = vpbroadcastd_avx512vl();
                    local_2920 = ZEXT1632(auVar95);
                    auVar49 = vpcmpeqd_avx2(auVar65,auVar65);
                    local_2b58[1] = auVar49;
                    *local_2b58 = auVar49;
                    local_2880 = pRVar5->instID[0];
                    local_2860 = pRVar5->instPrimID[0];
                    auVar49 = vmulps_avx512vl(ZEXT1632(auVar47),auVar61);
                    bVar44 = (bool)(bVar35 >> 1 & 1);
                    bVar7 = (bool)(bVar35 >> 2 & 1);
                    bVar8 = (bool)(bVar35 >> 3 & 1);
                    bVar9 = (bool)(bVar35 >> 4 & 1);
                    bVar10 = (bool)(bVar35 >> 5 & 1);
                    bVar11 = (bool)(bVar35 >> 6 & 1);
                    *(uint *)(ray + 0x100) =
                         (uint)(bVar35 & 1) * auVar49._0_4_ |
                         (uint)!(bool)(bVar35 & 1) * (int)local_2980;
                    *(uint *)(ray + 0x104) =
                         (uint)bVar44 * auVar49._4_4_ | (uint)!bVar44 * (int)fStack_297c;
                    *(uint *)(ray + 0x108) =
                         (uint)bVar7 * auVar49._8_4_ | (uint)!bVar7 * (int)fStack_2978;
                    *(uint *)(ray + 0x10c) =
                         (uint)bVar8 * auVar49._12_4_ | (uint)!bVar8 * (int)fStack_2974;
                    *(uint *)(ray + 0x110) =
                         (uint)bVar9 * auVar49._16_4_ | (uint)!bVar9 * (int)fStack_2970;
                    *(uint *)(ray + 0x114) =
                         (uint)bVar10 * auVar49._20_4_ | (uint)!bVar10 * (int)fStack_296c;
                    *(uint *)(ray + 0x118) =
                         (uint)bVar11 * auVar49._24_4_ | (uint)!bVar11 * (int)fStack_2968;
                    *(uint *)(ray + 0x11c) =
                         (uint)(bVar35 >> 7) * auVar49._28_4_ |
                         (uint)!(bool)(bVar35 >> 7) * iStack_2964;
                    local_2ae0 = vpmovm2d_avx512vl((ulong)bVar35);
                    local_2b50.valid = (int *)local_2ae0;
                    local_2b50.geometryUserPtr = local_2b68->userPtr;
                    local_2b50.context = context->user;
                    local_2b50.hit = local_2960;
                    local_2b50.N = 8;
                    local_2b50.ray = (RTCRayN *)ray;
                    local_2960 = (RTCHitN  [32])auVar65;
                    local_2940 = auVar66;
                    uStack_287c = local_2880;
                    uStack_2878 = local_2880;
                    uStack_2874 = local_2880;
                    uStack_2870 = local_2880;
                    uStack_286c = local_2880;
                    uStack_2868 = local_2880;
                    uStack_2864 = local_2880;
                    uStack_285c = local_2860;
                    uStack_2858 = local_2860;
                    uStack_2854 = local_2860;
                    uStack_2850 = local_2860;
                    uStack_284c = local_2860;
                    uStack_2848 = local_2860;
                    uStack_2844 = local_2860;
                    auVar73 = ZEXT436(uVar2);
                    auVar78 = (undefined1  [36])0x0;
                    if (local_2b68->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar78 = (undefined1  [36])0x0;
                      in_ZMM12 = ZEXT864(0) << 0x20;
                      in_ZMM13 = ZEXT1664(auVar17);
                      in_ZMM14 = ZEXT1664(auVar18);
                      (*local_2b68->occlusionFilterN)(&local_2b50);
                      auVar73 = extraout_var;
                    }
                    uVar34 = vptestmd_avx512vl(local_2ae0,local_2ae0);
                    if ((char)uVar34 != '\0') {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_2b68->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar78 = (undefined1  [36])0x0;
                        in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                        (*p_Var6)(&local_2b50);
                        auVar73 = extraout_var_00;
                      }
                      uVar34 = vptestmd_avx512vl(local_2ae0,local_2ae0);
                      auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar44 = (bool)((byte)uVar34 & 1);
                      bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar34 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar34 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar34 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar34 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar34 >> 6) & 1);
                      bVar13 = SUB81(uVar34 >> 7,0);
                      *(uint *)(local_2b50.ray + 0x100) =
                           (uint)bVar44 * auVar49._0_4_ |
                           (uint)!bVar44 * *(int *)(local_2b50.ray + 0x100);
                      *(uint *)(local_2b50.ray + 0x104) =
                           (uint)bVar7 * auVar49._4_4_ |
                           (uint)!bVar7 * *(int *)(local_2b50.ray + 0x104);
                      *(uint *)(local_2b50.ray + 0x108) =
                           (uint)bVar8 * auVar49._8_4_ |
                           (uint)!bVar8 * *(int *)(local_2b50.ray + 0x108);
                      *(uint *)(local_2b50.ray + 0x10c) =
                           (uint)bVar9 * auVar49._12_4_ |
                           (uint)!bVar9 * *(int *)(local_2b50.ray + 0x10c);
                      *(uint *)(local_2b50.ray + 0x110) =
                           (uint)bVar10 * auVar49._16_4_ |
                           (uint)!bVar10 * *(int *)(local_2b50.ray + 0x110);
                      *(uint *)(local_2b50.ray + 0x114) =
                           (uint)bVar11 * auVar49._20_4_ |
                           (uint)!bVar11 * *(int *)(local_2b50.ray + 0x114);
                      *(uint *)(local_2b50.ray + 0x118) =
                           (uint)bVar12 * auVar49._24_4_ |
                           (uint)!bVar12 * *(int *)(local_2b50.ray + 0x118);
                      *(uint *)(local_2b50.ray + 0x11c) =
                           (uint)bVar13 * auVar49._28_4_ |
                           (uint)!bVar13 * *(int *)(local_2b50.ray + 0x11c);
                    }
                    bVar35 = (byte)uVar34;
                    auVar56._0_4_ =
                         (uint)(bVar35 & 1) * *(int *)local_2b60 |
                         (uint)!(bool)(bVar35 & 1) * (int)local_2980;
                    bVar44 = (bool)((byte)(uVar34 >> 1) & 1);
                    auVar56._4_4_ =
                         (uint)bVar44 * *(int *)(local_2b60 + 4) | (uint)!bVar44 * (int)fStack_297c;
                    bVar44 = (bool)((byte)(uVar34 >> 2) & 1);
                    auVar56._8_4_ =
                         (uint)bVar44 * *(int *)(local_2b60 + 8) | (uint)!bVar44 * (int)fStack_2978;
                    bVar44 = (bool)((byte)(uVar34 >> 3) & 1);
                    auVar56._12_4_ =
                         (uint)bVar44 * *(int *)(local_2b60 + 0xc) |
                         (uint)!bVar44 * (int)fStack_2974;
                    bVar44 = (bool)((byte)(uVar34 >> 4) & 1);
                    auVar56._16_4_ =
                         (uint)bVar44 * *(int *)(local_2b60 + 0x10) |
                         (uint)!bVar44 * (int)fStack_2970;
                    bVar44 = (bool)((byte)(uVar34 >> 5) & 1);
                    auVar56._20_4_ =
                         (uint)bVar44 * *(int *)(local_2b60 + 0x14) |
                         (uint)!bVar44 * (int)fStack_296c;
                    bVar44 = (bool)((byte)(uVar34 >> 6) & 1);
                    auVar56._24_4_ =
                         (uint)bVar44 * *(int *)(local_2b60 + 0x18) |
                         (uint)!bVar44 * (int)fStack_2968;
                    bVar44 = SUB81(uVar34 >> 7,0);
                    auVar56._28_4_ =
                         (uint)bVar44 * *(int *)(local_2b60 + 0x1c) | (uint)!bVar44 * iStack_2964;
                    *(undefined1 (*) [32])local_2b60 = auVar56;
                  }
                  bVar36 = bVar36 & ~bVar35;
                }
              }
            }
          }
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar113 = ZEXT3264(auVar49);
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar114 = ZEXT3264(auVar49);
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar115 = ZEXT3264(auVar49);
          uVar45 = uVar45 & 0xffffffff;
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar116 = ZEXT3264(auVar49);
          auVar46 = vxorps_avx512vl(auVar46,auVar46);
          auVar117 = ZEXT1664(auVar46);
          auVar57 = local_2b20;
          auVar60 = local_2a60;
          auVar58 = local_2b00;
          auVar61 = local_2a80;
          auVar59 = local_29e0;
          auVar62 = local_2aa0;
          auVar54 = local_2a00;
          auVar55 = local_2a20;
          auVar56 = local_2a40;
        }
      }
      auVar46 = auVar117._0_16_;
      if (bVar36 == 0) {
        bVar44 = false;
      }
      else {
        auVar50 = vsubps_avx512vl(auVar57,auVar60);
        auVar53 = vsubps_avx512vl(auVar58,auVar61);
        auVar67 = vsubps_avx512vl(auVar59,auVar62);
        auVar68 = vsubps_avx512vl(auVar54,auVar57);
        auVar60 = vsubps_avx512vl(auVar55,auVar58);
        auVar61 = vsubps_avx512vl(auVar56,auVar59);
        auVar49 = vmulps_avx512vl(auVar53,auVar61);
        auVar48 = vfmsub231ps_fma(auVar49,auVar60,auVar67);
        auVar72._0_4_ = auVar67._0_4_ * auVar68._0_4_;
        auVar72._4_4_ = auVar67._4_4_ * auVar68._4_4_;
        auVar72._8_4_ = auVar67._8_4_ * auVar68._8_4_;
        auVar72._12_4_ = auVar67._12_4_ * auVar68._12_4_;
        auVar72._16_4_ = auVar67._16_4_ * auVar68._16_4_;
        auVar72._20_4_ = auVar67._20_4_ * auVar68._20_4_;
        auVar72._24_4_ = auVar67._24_4_ * auVar68._24_4_;
        auVar72._28_36_ = auVar73;
        auVar62 = vfmsub231ps_avx512vl(auVar72._0_32_,auVar61,auVar50);
        auVar77._0_4_ = auVar60._0_4_ * auVar50._0_4_;
        auVar77._4_4_ = auVar60._4_4_ * auVar50._4_4_;
        auVar77._8_4_ = auVar60._8_4_ * auVar50._8_4_;
        auVar77._12_4_ = auVar60._12_4_ * auVar50._12_4_;
        auVar77._16_4_ = auVar60._16_4_ * auVar50._16_4_;
        auVar77._20_4_ = auVar60._20_4_ * auVar50._20_4_;
        auVar77._24_4_ = auVar60._24_4_ * auVar50._24_4_;
        auVar77._28_36_ = auVar78;
        auVar95 = vfmsub231ps_fma(auVar77._0_32_,auVar68,auVar53);
        auVar57 = vsubps_avx512vl(auVar57,*(undefined1 (*) [32])ray);
        auVar58 = vsubps_avx512vl(auVar58,*(undefined1 (*) [32])(ray + 0x20));
        auVar59 = vsubps_avx512vl(auVar59,*(undefined1 (*) [32])(ray + 0x40));
        auVar49 = *(undefined1 (*) [32])(ray + 0x80);
        auVar51 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar52 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar54 = vmulps_avx512vl(auVar51,auVar59);
        auVar99 = vfmsub231ps_fma(auVar54,auVar58,auVar52);
        in_ZMM12 = ZEXT1664(auVar99);
        auVar109._0_4_ = auVar52._0_4_ * auVar57._0_4_;
        auVar109._4_4_ = auVar52._4_4_ * auVar57._4_4_;
        auVar109._8_4_ = auVar52._8_4_ * auVar57._8_4_;
        auVar109._12_4_ = auVar52._12_4_ * auVar57._12_4_;
        auVar109._16_4_ = auVar52._16_4_ * auVar57._16_4_;
        auVar109._20_4_ = auVar52._20_4_ * auVar57._20_4_;
        auVar109._28_36_ = in_ZMM13._28_36_;
        auVar109._24_4_ = auVar52._24_4_ * auVar57._24_4_;
        auVar17 = vfmsub231ps_fma(auVar109._0_32_,auVar59,auVar49);
        in_ZMM13 = ZEXT1664(auVar17);
        auVar111._0_4_ = auVar49._0_4_ * auVar58._0_4_;
        auVar111._4_4_ = auVar49._4_4_ * auVar58._4_4_;
        auVar111._8_4_ = auVar49._8_4_ * auVar58._8_4_;
        auVar111._12_4_ = auVar49._12_4_ * auVar58._12_4_;
        auVar111._16_4_ = auVar49._16_4_ * auVar58._16_4_;
        auVar111._20_4_ = auVar49._20_4_ * auVar58._20_4_;
        auVar111._28_36_ = in_ZMM14._28_36_;
        auVar111._24_4_ = auVar49._24_4_ * auVar58._24_4_;
        auVar54 = vfmsub231ps_avx512vl(auVar111._0_32_,auVar57,auVar51);
        in_ZMM14 = ZEXT3264(auVar54);
        auVar22._4_4_ = auVar52._4_4_ * auVar95._4_4_;
        auVar22._0_4_ = auVar52._0_4_ * auVar95._0_4_;
        auVar22._8_4_ = auVar52._8_4_ * auVar95._8_4_;
        auVar22._12_4_ = auVar52._12_4_ * auVar95._12_4_;
        auVar22._16_4_ = auVar52._16_4_ * 0.0;
        auVar22._20_4_ = auVar52._20_4_ * 0.0;
        auVar22._24_4_ = auVar52._24_4_ * 0.0;
        auVar22._28_4_ = auVar52._28_4_;
        auVar51 = vfmadd231ps_avx512vl(auVar22,auVar62,auVar51);
        auVar47 = vfmadd231ps_fma(auVar51,ZEXT1632(auVar48),auVar49);
        vandps_avx512vl(ZEXT1632(auVar47),auVar116._0_32_);
        auVar49 = vmulps_avx512vl(auVar61,auVar54);
        auVar49 = vfmadd231ps_avx512vl(auVar49,ZEXT1632(auVar17),auVar60);
        auVar49 = vfmadd231ps_avx512vl(auVar49,ZEXT1632(auVar99),auVar68);
        auVar49 = vxorps_avx512vl(auVar51,auVar49);
        uVar14 = vcmpps_avx512vl(auVar49,auVar117._0_32_,5);
        bVar35 = (byte)uVar14 & bVar36;
        if (bVar35 != 0) {
          auVar23._4_4_ = auVar67._4_4_ * auVar54._4_4_;
          auVar23._0_4_ = auVar67._0_4_ * auVar54._0_4_;
          auVar23._8_4_ = auVar67._8_4_ * auVar54._8_4_;
          auVar23._12_4_ = auVar67._12_4_ * auVar54._12_4_;
          auVar23._16_4_ = auVar67._16_4_ * auVar54._16_4_;
          auVar23._20_4_ = auVar67._20_4_ * auVar54._20_4_;
          auVar23._24_4_ = auVar67._24_4_ * auVar54._24_4_;
          auVar23._28_4_ = auVar67._28_4_;
          auVar18 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar17),auVar23);
          auVar99 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar99),ZEXT1632(auVar18));
          auVar94._0_4_ = (float)(auVar51._0_4_ ^ auVar99._0_4_);
          auVar94._4_4_ = (float)(auVar51._4_4_ ^ auVar99._4_4_);
          auVar94._8_4_ = (float)(auVar51._8_4_ ^ auVar99._8_4_);
          auVar94._12_4_ = (float)(auVar51._12_4_ ^ auVar99._12_4_);
          fVar70 = auVar51._16_4_;
          auVar94._16_4_ = fVar70;
          fVar92 = auVar51._20_4_;
          auVar94._20_4_ = fVar92;
          fVar75 = auVar51._24_4_;
          auVar94._24_4_ = fVar75;
          uVar41 = auVar51._28_4_;
          auVar94._28_4_ = uVar41;
          uVar14 = vcmpps_avx512vl(auVar94,auVar117._0_32_,5);
          bVar35 = bVar35 & (byte)uVar14;
          if (bVar35 != 0) {
            in_ZMM12 = ZEXT864(0) << 0x20;
            vandps_avx512vl(ZEXT1632(auVar47),auVar113._0_32_);
            auVar52 = vsubps_avx(auVar49,auVar49);
            uVar14 = vcmpps_avx512vl(auVar52,auVar94,5);
            bVar35 = bVar35 & (byte)uVar14;
            if (bVar35 != 0) {
              auVar24._4_4_ = auVar59._4_4_ * auVar95._4_4_;
              auVar24._0_4_ = auVar59._0_4_ * auVar95._0_4_;
              auVar24._8_4_ = auVar59._8_4_ * auVar95._8_4_;
              auVar24._12_4_ = auVar59._12_4_ * auVar95._12_4_;
              auVar24._16_4_ = auVar59._16_4_ * 0.0;
              auVar24._20_4_ = auVar59._20_4_ * 0.0;
              auVar24._24_4_ = auVar59._24_4_ * 0.0;
              auVar24._28_4_ = auVar59._28_4_;
              auVar99 = vfmadd213ps_fma(auVar58,auVar62,auVar24);
              auVar99 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar48),ZEXT1632(auVar99));
              auVar91._0_4_ = auVar51._0_4_ ^ auVar99._0_4_;
              auVar91._4_4_ = auVar51._4_4_ ^ auVar99._4_4_;
              auVar91._8_4_ = auVar51._8_4_ ^ auVar99._8_4_;
              auVar91._12_4_ = auVar51._12_4_ ^ auVar99._12_4_;
              auVar91._16_4_ = fVar70;
              auVar91._20_4_ = fVar92;
              auVar91._24_4_ = fVar75;
              auVar91._28_4_ = uVar41;
              fVar71 = auVar49._0_4_;
              auVar97._0_4_ = fVar71 * *(float *)(ray + 0x60);
              fVar81 = auVar49._4_4_;
              auVar97._4_4_ = fVar81 * *(float *)(ray + 100);
              fVar82 = auVar49._8_4_;
              auVar97._8_4_ = fVar82 * *(float *)(ray + 0x68);
              fVar83 = auVar49._12_4_;
              auVar97._12_4_ = fVar83 * *(float *)(ray + 0x6c);
              fVar84 = auVar49._16_4_;
              auVar97._16_4_ = fVar84 * *(float *)(ray + 0x70);
              fVar85 = auVar49._20_4_;
              auVar97._20_4_ = fVar85 * *(float *)(ray + 0x74);
              fVar86 = auVar49._24_4_;
              auVar97._24_4_ = fVar86 * *(float *)(ray + 0x78);
              auVar97._28_4_ = 0;
              pRVar1 = ray + 0x100;
              auVar31 = *(undefined1 (*) [28])pRVar1;
              iVar33 = *(int *)(ray + 0x11c);
              auVar51 = *(undefined1 (*) [32])pRVar1;
              auVar25._4_4_ = *(float *)(ray + 0x104) * fVar81;
              auVar25._0_4_ = *(float *)pRVar1 * fVar71;
              auVar25._8_4_ = *(float *)(ray + 0x108) * fVar82;
              auVar25._12_4_ = *(float *)(ray + 0x10c) * fVar83;
              auVar25._16_4_ = *(float *)(ray + 0x110) * fVar84;
              auVar25._20_4_ = *(float *)(ray + 0x114) * fVar85;
              auVar25._24_4_ = *(float *)(ray + 0x118) * fVar86;
              auVar25._28_4_ = iVar33;
              uVar14 = vcmpps_avx512vl(auVar91,auVar25,2);
              uVar15 = vcmpps_avx512vl(auVar97,auVar91,1);
              bVar35 = bVar35 & (byte)uVar14 & (byte)uVar15;
              local_2b00 = auVar51;
              if (bVar35 != 0) {
                uVar14 = vcmpps_avx512vl(ZEXT1632(auVar47),ZEXT832(0) << 0x20,4);
                bVar35 = bVar35 & (byte)uVar14;
                if (bVar35 != 0) {
                  pGVar4 = (context->scene->geometries).items[*(uint *)(lVar37 + uVar40 * 4)].ptr;
                  local_2b20._0_8_ = pGVar4;
                  uVar2 = pGVar4->mask;
                  auVar98._4_4_ = uVar2;
                  auVar98._0_4_ = uVar2;
                  auVar98._8_4_ = uVar2;
                  auVar98._12_4_ = uVar2;
                  auVar98._16_4_ = uVar2;
                  auVar98._20_4_ = uVar2;
                  auVar98._24_4_ = uVar2;
                  auVar98._28_4_ = uVar2;
                  uVar14 = vptestmd_avx512vl(auVar98,*(undefined1 (*) [32])(ray + 0x120));
                  bVar35 = bVar35 & (byte)uVar14;
                  if (bVar35 != 0) {
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar51 = vrcp14ps_avx512vl(auVar49);
                      auVar102._8_4_ = 0x3f800000;
                      auVar102._0_8_ = &DAT_3f8000003f800000;
                      auVar102._12_4_ = 0x3f800000;
                      auVar102._16_4_ = 0x3f800000;
                      auVar102._20_4_ = 0x3f800000;
                      auVar102._24_4_ = 0x3f800000;
                      auVar102._28_4_ = 0x3f800000;
                      auVar47 = vfnmadd213ps_fma(auVar49,auVar51,auVar102);
                      auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar51,auVar51);
                      auVar26._4_4_ = auVar47._4_4_ * fVar81;
                      auVar26._0_4_ = auVar47._0_4_ * fVar71;
                      auVar26._8_4_ = auVar47._8_4_ * fVar82;
                      auVar26._12_4_ = auVar47._12_4_ * fVar83;
                      auVar26._16_4_ = fVar84 * 0.0;
                      auVar26._20_4_ = fVar85 * 0.0;
                      auVar26._24_4_ = fVar86 * 0.0;
                      auVar26._28_4_ = auVar49._28_4_;
                      auVar49 = vminps_avx(auVar26,auVar102);
                      auVar27._4_4_ = auVar47._4_4_ * auVar94._4_4_;
                      auVar27._0_4_ = auVar47._0_4_ * auVar94._0_4_;
                      auVar27._8_4_ = auVar47._8_4_ * auVar94._8_4_;
                      auVar27._12_4_ = auVar47._12_4_ * auVar94._12_4_;
                      auVar27._16_4_ = fVar70 * 0.0;
                      auVar27._20_4_ = fVar92 * 0.0;
                      auVar27._24_4_ = fVar75 * 0.0;
                      auVar27._28_4_ = uVar41;
                      auVar51 = vminps_avx(auVar27,auVar102);
                      local_2900 = vsubps_avx(auVar102,auVar49);
                      local_28e0 = vsubps_avx(auVar102,auVar51);
                      pRVar5 = context->user;
                      local_28a0 = vpbroadcastd_avx512vl();
                      local_28c0 = vpbroadcastd_avx512vl();
                      local_2960 = (RTCHitN  [32])ZEXT1632(auVar48);
                      local_2920 = ZEXT1632(auVar95);
                      auVar49 = vpcmpeqd_avx2((undefined1  [32])local_2960,
                                              (undefined1  [32])local_2960);
                      local_2b58[1] = auVar49;
                      *local_2b58 = auVar49;
                      local_2880 = pRVar5->instID[0];
                      local_2860 = pRVar5->instPrimID[0];
                      local_2b00._0_4_ = auVar31._0_4_;
                      local_2b00._4_4_ = auVar31._4_4_;
                      local_2b00._8_4_ = auVar31._8_4_;
                      local_2b00._12_4_ = auVar31._12_4_;
                      local_2b00._16_4_ = auVar31._16_4_;
                      local_2b00._20_4_ = auVar31._20_4_;
                      local_2b00._24_4_ = auVar31._24_4_;
                      auVar49 = vmulps_avx512vl(ZEXT1632(auVar47),auVar91);
                      bVar44 = (bool)(bVar35 >> 1 & 1);
                      bVar7 = (bool)(bVar35 >> 2 & 1);
                      bVar8 = (bool)(bVar35 >> 3 & 1);
                      bVar9 = (bool)(bVar35 >> 4 & 1);
                      bVar10 = (bool)(bVar35 >> 5 & 1);
                      bVar11 = (bool)(bVar35 >> 6 & 1);
                      *(uint *)(ray + 0x100) =
                           (uint)(bVar35 & 1) * auVar49._0_4_ |
                           (uint)!(bool)(bVar35 & 1) * local_2b00._0_4_;
                      *(uint *)(ray + 0x104) =
                           (uint)bVar44 * auVar49._4_4_ | (uint)!bVar44 * local_2b00._4_4_;
                      *(uint *)(ray + 0x108) =
                           (uint)bVar7 * auVar49._8_4_ | (uint)!bVar7 * local_2b00._8_4_;
                      *(uint *)(ray + 0x10c) =
                           (uint)bVar8 * auVar49._12_4_ | (uint)!bVar8 * local_2b00._12_4_;
                      *(uint *)(ray + 0x110) =
                           (uint)bVar9 * auVar49._16_4_ | (uint)!bVar9 * local_2b00._16_4_;
                      *(uint *)(ray + 0x114) =
                           (uint)bVar10 * auVar49._20_4_ | (uint)!bVar10 * local_2b00._20_4_;
                      *(uint *)(ray + 0x118) =
                           (uint)bVar11 * auVar49._24_4_ | (uint)!bVar11 * local_2b00._24_4_;
                      *(uint *)(ray + 0x11c) =
                           (uint)(bVar35 >> 7) * auVar49._28_4_ |
                           (uint)!(bool)(bVar35 >> 7) * iVar33;
                      local_2ae0 = vpmovm2d_avx512vl((ulong)bVar35);
                      local_2b50.valid = (int *)local_2ae0;
                      local_2b50.geometryUserPtr = pGVar4->userPtr;
                      local_2b50.context = context->user;
                      local_2b50.hit = local_2960;
                      local_2b50.N = 8;
                      local_2b50.ray = (RTCRayN *)ray;
                      local_2940 = auVar62;
                      uStack_287c = local_2880;
                      uStack_2878 = local_2880;
                      uStack_2874 = local_2880;
                      uStack_2870 = local_2880;
                      uStack_286c = local_2880;
                      uStack_2868 = local_2880;
                      uStack_2864 = local_2880;
                      uStack_285c = local_2860;
                      uStack_2858 = local_2860;
                      uStack_2854 = local_2860;
                      uStack_2850 = local_2860;
                      uStack_284c = local_2860;
                      uStack_2848 = local_2860;
                      uStack_2844 = local_2860;
                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        in_ZMM12 = ZEXT864(0) << 0x20;
                        in_ZMM13 = ZEXT1664(auVar17);
                        in_ZMM14 = ZEXT1664(auVar54._0_16_);
                        (*pGVar4->occlusionFilterN)(&local_2b50);
                      }
                      uVar34 = vptestmd_avx512vl(local_2ae0,local_2ae0);
                      if ((char)uVar34 != '\0') {
                        p_Var6 = context->args->filter;
                        if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_2b20._0_8_ + 0x3e) & 0x40) != 0)))) {
                          in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                          in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                          in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                          (*p_Var6)(&local_2b50);
                        }
                        uVar34 = vptestmd_avx512vl(local_2ae0,local_2ae0);
                        auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar44 = (bool)((byte)uVar34 & 1);
                        bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar8 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar9 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar10 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar13 = SUB81(uVar34 >> 7,0);
                        *(uint *)(local_2b50.ray + 0x100) =
                             (uint)bVar44 * auVar49._0_4_ |
                             (uint)!bVar44 * *(int *)(local_2b50.ray + 0x100);
                        *(uint *)(local_2b50.ray + 0x104) =
                             (uint)bVar7 * auVar49._4_4_ |
                             (uint)!bVar7 * *(int *)(local_2b50.ray + 0x104);
                        *(uint *)(local_2b50.ray + 0x108) =
                             (uint)bVar8 * auVar49._8_4_ |
                             (uint)!bVar8 * *(int *)(local_2b50.ray + 0x108);
                        *(uint *)(local_2b50.ray + 0x10c) =
                             (uint)bVar9 * auVar49._12_4_ |
                             (uint)!bVar9 * *(int *)(local_2b50.ray + 0x10c);
                        *(uint *)(local_2b50.ray + 0x110) =
                             (uint)bVar10 * auVar49._16_4_ |
                             (uint)!bVar10 * *(int *)(local_2b50.ray + 0x110);
                        *(uint *)(local_2b50.ray + 0x114) =
                             (uint)bVar11 * auVar49._20_4_ |
                             (uint)!bVar11 * *(int *)(local_2b50.ray + 0x114);
                        *(uint *)(local_2b50.ray + 0x118) =
                             (uint)bVar12 * auVar49._24_4_ |
                             (uint)!bVar12 * *(int *)(local_2b50.ray + 0x118);
                        *(uint *)(local_2b50.ray + 0x11c) =
                             (uint)bVar13 * auVar49._28_4_ |
                             (uint)!bVar13 * *(int *)(local_2b50.ray + 0x11c);
                      }
                      bVar35 = (byte)uVar34;
                      auVar69._0_4_ =
                           (uint)(bVar35 & 1) * *(int *)local_2b60 |
                           (uint)!(bool)(bVar35 & 1) * local_2b00._0_4_;
                      bVar44 = (bool)((byte)(uVar34 >> 1) & 1);
                      auVar69._4_4_ =
                           (uint)bVar44 * *(int *)(local_2b60 + 4) |
                           (uint)!bVar44 * local_2b00._4_4_;
                      bVar44 = (bool)((byte)(uVar34 >> 2) & 1);
                      auVar69._8_4_ =
                           (uint)bVar44 * *(int *)(local_2b60 + 8) |
                           (uint)!bVar44 * local_2b00._8_4_;
                      bVar44 = (bool)((byte)(uVar34 >> 3) & 1);
                      auVar69._12_4_ =
                           (uint)bVar44 * *(int *)(local_2b60 + 0xc) |
                           (uint)!bVar44 * local_2b00._12_4_;
                      bVar44 = (bool)((byte)(uVar34 >> 4) & 1);
                      auVar69._16_4_ =
                           (uint)bVar44 * *(int *)(local_2b60 + 0x10) |
                           (uint)!bVar44 * local_2b00._16_4_;
                      bVar44 = (bool)((byte)(uVar34 >> 5) & 1);
                      auVar69._20_4_ =
                           (uint)bVar44 * *(int *)(local_2b60 + 0x14) |
                           (uint)!bVar44 * local_2b00._20_4_;
                      bVar44 = (bool)((byte)(uVar34 >> 6) & 1);
                      auVar69._24_4_ =
                           (uint)bVar44 * *(int *)(local_2b60 + 0x18) |
                           (uint)!bVar44 * local_2b00._24_4_;
                      bVar44 = SUB81(uVar34 >> 7,0);
                      auVar69._28_4_ =
                           (uint)bVar44 * *(int *)(local_2b60 + 0x1c) |
                           (uint)!bVar44 * local_2b00._28_4_;
                      *(undefined1 (*) [32])local_2b60 = auVar69;
                    }
                    bVar36 = bVar36 & ~bVar35;
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar113 = ZEXT3264(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar114 = ZEXT3264(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar115 = ZEXT3264(auVar49);
                    uVar45 = uVar45 & 0xffffffff;
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar116 = ZEXT3264(auVar49);
                    auVar46 = vxorps_avx512vl(auVar46,auVar46);
                    auVar117 = ZEXT1664(auVar46);
                    goto LAB_007a881b;
                  }
                }
              }
            }
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar113 = ZEXT3264(auVar49);
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar114 = ZEXT3264(auVar49);
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar115 = ZEXT3264(auVar49);
            uVar45 = uVar45 & 0xffffffff;
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar116 = ZEXT3264(auVar49);
            auVar46 = vxorps_avx512vl(auVar46,auVar46);
            auVar117 = ZEXT1664(auVar46);
          }
        }
LAB_007a881b:
        bVar44 = bVar36 != 0;
      }
      if ((!bVar44) || (bVar44 = 2 < uVar40, uVar40 = uVar40 + 1, bVar44)) break;
    }
    bVar38 = bVar38 & bVar36;
    if (bVar38 == 0) break;
  }
  bVar38 = ~bVar38;
LAB_007a904e:
  bVar32 = bVar32 | bVar38;
  uVar42 = local_2b70;
  if (bVar32 == 0xff) {
LAB_007a907d:
    iVar33 = 3;
  }
  else {
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    local_2640._0_4_ =
         (uint)(bVar32 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar32 & 1) * local_2640._0_4_;
    bVar44 = (bool)(bVar32 >> 1 & 1);
    local_2640._4_4_ = (uint)bVar44 * auVar49._4_4_ | (uint)!bVar44 * local_2640._4_4_;
    bVar44 = (bool)(bVar32 >> 2 & 1);
    local_2640._8_4_ = (uint)bVar44 * auVar49._8_4_ | (uint)!bVar44 * local_2640._8_4_;
    bVar44 = (bool)(bVar32 >> 3 & 1);
    local_2640._12_4_ = (uint)bVar44 * auVar49._12_4_ | (uint)!bVar44 * local_2640._12_4_;
    bVar44 = (bool)(bVar32 >> 4 & 1);
    local_2640._16_4_ = (uint)bVar44 * auVar49._16_4_ | (uint)!bVar44 * local_2640._16_4_;
    bVar44 = (bool)(bVar32 >> 5 & 1);
    local_2640._20_4_ = (uint)bVar44 * auVar49._20_4_ | (uint)!bVar44 * local_2640._20_4_;
    bVar44 = (bool)(bVar32 >> 6 & 1);
    local_2640._24_4_ = (uint)bVar44 * auVar49._24_4_ | (uint)!bVar44 * local_2640._24_4_;
    local_2640._28_4_ =
         (uint)(bVar32 >> 7) * auVar49._28_4_ | (uint)!(bool)(bVar32 >> 7) * local_2640._28_4_;
    iVar33 = 0;
  }
LAB_007a9080:
  if (iVar33 == 3) {
    bVar32 = bVar32 & (byte)uVar45;
    bVar44 = (bool)(bVar32 >> 1 & 1);
    bVar7 = (bool)(bVar32 >> 2 & 1);
    bVar8 = (bool)(bVar32 >> 3 & 1);
    bVar9 = (bool)(bVar32 >> 4 & 1);
    bVar10 = (bool)(bVar32 >> 5 & 1);
    bVar11 = (bool)(bVar32 >> 6 & 1);
    *(uint *)local_2b60 =
         (uint)(bVar32 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar32 & 1) * *(int *)local_2b60;
    *(uint *)(local_2b60 + 4) =
         (uint)bVar44 * auVar114._4_4_ | (uint)!bVar44 * *(int *)(local_2b60 + 4);
    *(uint *)(local_2b60 + 8) =
         (uint)bVar7 * auVar114._8_4_ | (uint)!bVar7 * *(int *)(local_2b60 + 8);
    *(uint *)(local_2b60 + 0xc) =
         (uint)bVar8 * auVar114._12_4_ | (uint)!bVar8 * *(int *)(local_2b60 + 0xc);
    *(uint *)(local_2b60 + 0x10) =
         (uint)bVar9 * auVar114._16_4_ | (uint)!bVar9 * *(int *)(local_2b60 + 0x10);
    *(uint *)(local_2b60 + 0x14) =
         (uint)bVar10 * auVar114._20_4_ | (uint)!bVar10 * *(int *)(local_2b60 + 0x14);
    *(uint *)(local_2b60 + 0x18) =
         (uint)bVar11 * auVar114._24_4_ | (uint)!bVar11 * *(int *)(local_2b60 + 0x18);
    *(uint *)(local_2b60 + 0x1c) =
         (uint)(bVar32 >> 7) * auVar114._28_4_ |
         (uint)!(bool)(bVar32 >> 7) * *(int *)(local_2b60 + 0x1c);
    return;
  }
  goto LAB_007a838a;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }